

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O2

size_t __thiscall TBSCertificate::SetDataSize(TBSCertificate *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  
  sVar1 = ContextSpecificHolder<Integer,_(unsigned_char)'\xa0',_(OptionType)1>::EncodedSize
                    (&this->version);
  sVar2 = DerBase::EncodedSize(&(this->serialNumber).super_DerBase);
  sVar3 = DerBase::EncodedSize(&(this->signature).super_DerBase);
  sVar4 = DerBase::EncodedSize(&(this->issuer).rdnSequence.super_DerBase);
  sVar5 = DerBase::EncodedSize(&(this->validity).super_DerBase);
  sVar6 = DerBase::EncodedSize(&(this->subject).rdnSequence.super_DerBase);
  sVar7 = DerBase::EncodedSize(&(this->subjectPublicKeyInfo).super_DerBase);
  sVar8 = ContextSpecificHolder<BitString,_(unsigned_char)'\x81',_(OptionType)0>::EncodedSize
                    (&this->issuerUniqueID);
  sVar9 = ContextSpecificHolder<BitString,_(unsigned_char)'\x82',_(OptionType)0>::EncodedSize
                    (&this->subjectUniqueID);
  sVar10 = ContextSpecificHolder<Extensions,_(unsigned_char)'\xa3',_(OptionType)1>::EncodedSize
                     (&this->extensions);
  sVar1 = sVar10 + sVar9 + sVar8 + sVar6 + sVar5 + sVar7 + sVar4 + sVar3 + sVar2 + sVar1;
  (this->super_DerBase).cbData = sVar1;
  return sVar1;
}

Assistant:

virtual size_t SetDataSize() override
	{
        // To facilitate debugging
        size_t cbVersion = version.EncodedSize();
        size_t cbSerial = serialNumber.EncodedSize();
        size_t cbSignature = signature.EncodedSize();
        size_t cbIssuer = issuer.EncodedSize();
        size_t cbValidity = validity.EncodedSize();
        size_t cbSubject = subject.EncodedSize();
        size_t cbPublicKey = subjectPublicKeyInfo.EncodedSize();
        size_t cbIssuerId = issuerUniqueID.EncodedSize();
        size_t cbSubjectId = subjectUniqueID.EncodedSize();
        size_t cbExtensions = extensions.EncodedSize();

		cbData =
			cbVersion +
			cbSerial +
			cbSignature +
			cbIssuer +
			cbValidity + 
			cbSubject + 
			cbPublicKey +
			cbIssuerId +
			cbSubjectId +
			cbExtensions;

		return cbData;
	}